

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cc
# Opt level: O2

void __thiscall RigidBodyDynamics::Model::SetBodyMass(Model *this,uint id,double mass)

{
  pointer pFVar1;
  uint uVar2;
  pointer pFVar3;
  pointer pBVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  Matrix3d *pMVar8;
  Matrix3d *pMVar9;
  byte bVar10;
  Body local_a0;
  
  bVar10 = 0;
  bVar5 = IsFixedBodyId(this,id);
  if (bVar5) {
    uVar6 = id - this->fixed_body_discriminator;
    pFVar3 = (this->mFixedBodies).
             super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
             .
             super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar2 = pFVar3[uVar6].mMovableParent;
    pBVar4 = (this->mBodies).
             super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
             .
             super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pFVar1 = pFVar3 + uVar6;
    local_a0.mMass = pFVar1->mMass;
    local_a0.mCenterOfMass.super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         *(double *)
          &(pFVar1->mCenterOfMass).super_Vector3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>;
    local_a0.mCenterOfMass.super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
         *(double *)((long)&(pFVar1->mCenterOfMass).super_Vector3d + 8);
    local_a0.mCenterOfMass.super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         *(double *)((long)&(pFVar1->mCenterOfMass).super_Vector3d + 0x10);
    pMVar8 = &pFVar1->mInertia;
    pMVar9 = &local_a0.mInertia;
    for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
      (pMVar9->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[0] =
           *(double *)
            &(pMVar8->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>;
      pMVar8 = (Matrix3d *)((long)pMVar8 + ((ulong)bVar10 * -2 + 1) * 8);
      pMVar9 = (Matrix3d *)((long)pMVar9 + ((ulong)bVar10 * -2 + 1) * 8);
    }
    local_a0.mIsVirtual = false;
    Body::Separate(pBVar4 + uVar2,&pFVar3[uVar6].mParentTransform,&local_a0);
    pFVar1->mMass = mass;
    uVar2 = pFVar1->mMovableParent;
    pBVar4 = (this->mBodies).
             super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
             .
             super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_a0.mCenterOfMass.super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         *(double *)
          &(pFVar1->mCenterOfMass).super_Vector3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>;
    local_a0.mCenterOfMass.super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
         *(double *)((long)&(pFVar1->mCenterOfMass).super_Vector3d + 8);
    local_a0.mCenterOfMass.super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         *(double *)((long)&(pFVar1->mCenterOfMass).super_Vector3d + 0x10);
    pMVar8 = &pFVar1->mInertia;
    pMVar9 = &local_a0.mInertia;
    for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
      (pMVar9->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[0] =
           *(double *)
            &(pMVar8->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>;
      pMVar8 = (Matrix3d *)((long)pMVar8 + ((ulong)bVar10 * -2 + 1) * 8);
      pMVar9 = (Matrix3d *)((long)pMVar9 + ((ulong)bVar10 * -2 + 1) * 8);
    }
    local_a0.mIsVirtual = false;
    local_a0.mMass = mass;
    Body::Join(pBVar4 + uVar2,&pFVar3[uVar6].mParentTransform,&local_a0);
  }
  else {
    (this->mBodies).
    super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>.
    super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>.
    _M_impl.super__Vector_impl_data._M_start[id].mMass = mass;
  }
  UpdateInertiaMatrixForBody(this,id);
  return;
}

Assistant:

void Model::SetBodyMass(const unsigned int id, const double mass)
{
  if(IsFixedBodyId(id))
  {
    // The inertial parameters of the fixed body have already been merged in the parent body,
    // in order to update correctly the parent body we need to first
    // remove the inertial effects of the fixed body from his parent body
    // Then update the fixed body inertia
    // Finally, merge it again in the parent body
    FixedBody& fixedbody(mFixedBodies[id - fixed_body_discriminator]);
    mBodies[fixedbody.mMovableParent].Separate(fixedbody.mParentTransform, fixedbody.ToBody());
    fixedbody.mMass = mass;
    mBodies[fixedbody.mMovableParent].Join(fixedbody.mParentTransform, fixedbody.ToBody());
  }
  else
  {
    mBodies[id].mMass = mass;
  }
  UpdateInertiaMatrixForBody(id);
}